

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O2

void __thiscall Address_EmptyAddressTest_Test::TestBody(Address_EmptyAddressTest_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper AStack_328;
  AssertionResult gtest_ar;
  Address local_300;
  Address empty_address;
  
  cfd::core::Address::Address(&empty_address);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&local_300,&empty_address);
  message = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"\"\"","empty_address.GetAddress().c_str()","",
             (char *)local_300._0_8_);
  std::__cxx11::string::~string((string *)&local_300);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_300);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x2b,message);
    testing::internal::AssertHelper::operator=(&AStack_328,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper(&AStack_328);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_300);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__cxx11::string::string((string *)&gtest_ar,"",(allocator *)&AStack_328);
    cfd::core::Address::Address(&local_300,(string *)&gtest_ar);
    cfd::core::Address::operator=(&empty_address,&local_300);
    cfd::core::Address::~Address(&local_300);
    std::__cxx11::string::~string((string *)&gtest_ar);
  }
  testing::Message::Message((Message *)&local_300);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
             ,0x2d,
             "Expected: (empty_address = Address(\"\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_300);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_300);
  cfd::core::Address::~Address(&empty_address);
  return;
}

Assistant:

TEST(Address, EmptyAddressTest) {
  Address empty_address;
  EXPECT_STREQ("", empty_address.GetAddress().c_str());

  EXPECT_THROW((empty_address = Address("")), CfdException);
}